

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

bool __thiscall absl::SimpleAtob(absl *this,string_view str,bool *value)

{
  bool bVar1;
  undefined1 uVar2;
  string_view piece1;
  string_view piece1_00;
  string_view piece1_01;
  string_view piece1_02;
  string_view piece1_03;
  string_view piece1_04;
  string_view piece1_05;
  string_view piece1_06;
  string_view piece1_07;
  string_view piece1_08;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  
  piece1.length_ = str.ptr_;
  if ((undefined1 *)str.length_ == (undefined1 *)0x0) {
    raw_logging_internal::RawLog
              (kFatal,"numbers.cc",0x88,"Check %s failed: %s","value != nullptr",
               "Output pointer must not be nullptr.");
  }
  string_view::string_view(&local_38,"true");
  piece1.ptr_ = (char *)this;
  bVar1 = anon_unknown_0::CaseEqual(piece1,local_38);
  uVar2 = 1;
  if (!bVar1) {
    string_view::string_view(&local_48,"t");
    piece1_00.length_ = (size_type)piece1.length_;
    piece1_00.ptr_ = (char *)this;
    bVar1 = anon_unknown_0::CaseEqual(piece1_00,local_48);
    if (!bVar1) {
      string_view::string_view(&local_58,"yes");
      piece1_01.length_ = (size_type)piece1.length_;
      piece1_01.ptr_ = (char *)this;
      bVar1 = anon_unknown_0::CaseEqual(piece1_01,local_58);
      if (!bVar1) {
        string_view::string_view(&local_68,"y");
        piece1_02.length_ = (size_type)piece1.length_;
        piece1_02.ptr_ = (char *)this;
        bVar1 = anon_unknown_0::CaseEqual(piece1_02,local_68);
        if (!bVar1) {
          string_view::string_view(&local_78,"1");
          piece1_03.length_ = (size_type)piece1.length_;
          piece1_03.ptr_ = (char *)this;
          bVar1 = anon_unknown_0::CaseEqual(piece1_03,local_78);
          if (!bVar1) {
            string_view::string_view(&local_88,"false");
            piece1_04.length_ = (size_type)piece1.length_;
            piece1_04.ptr_ = (char *)this;
            bVar1 = anon_unknown_0::CaseEqual(piece1_04,local_88);
            if (!bVar1) {
              string_view::string_view(&local_98,"f");
              piece1_05.length_ = (size_type)piece1.length_;
              piece1_05.ptr_ = (char *)this;
              bVar1 = anon_unknown_0::CaseEqual(piece1_05,local_98);
              if (!bVar1) {
                string_view::string_view(&local_a8,"no");
                piece1_06.length_ = (size_type)piece1.length_;
                piece1_06.ptr_ = (char *)this;
                bVar1 = anon_unknown_0::CaseEqual(piece1_06,local_a8);
                if (!bVar1) {
                  string_view::string_view(&local_b8,"n");
                  piece1_07.length_ = (size_type)piece1.length_;
                  piece1_07.ptr_ = (char *)this;
                  bVar1 = anon_unknown_0::CaseEqual(piece1_07,local_b8);
                  if (!bVar1) {
                    string_view::string_view(&local_c8,"0");
                    piece1_08.length_ = (size_type)piece1.length_;
                    piece1_08.ptr_ = (char *)this;
                    bVar1 = anon_unknown_0::CaseEqual(piece1_08,local_c8);
                    uVar2 = 0;
                    if (!bVar1) {
                      return false;
                    }
                    goto LAB_002667bd;
                  }
                }
              }
            }
            uVar2 = 0;
          }
        }
      }
    }
  }
LAB_002667bd:
  *(undefined1 *)str.length_ = uVar2;
  return true;
}

Assistant:

bool SimpleAtob(absl::string_view str, bool* value) {
  ABSL_RAW_CHECK(value != nullptr, "Output pointer must not be nullptr.");
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}